

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall Json_Whitespace_Test::Json_Whitespace_Test(Json_Whitespace_Test *this)

{
  Json_Whitespace_Test *this_local;
  
  anon_unknown.dwarf_94447::Json::Json(&this->super_Json);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__Json_Whitespace_Test_002597e8;
  return;
}

Assistant:

TEST_F (Json, Whitespace) {
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input ("   \t    null"s).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{13U, 1U}));
    }

    auto const cr = "\r"s;
    auto const lf = "\n"s;
    auto const crlf = cr + lf;
    auto const keyword = "null"s;
    auto const xord = static_cast<unsigned> (keyword.length ()) + 1U;

    {
        json::parser<json_out_callbacks> p2;
        p2.input (lf + lf + keyword); // POSIX-style line endings
        std::string const res = p2.eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p2.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p3;
        p3.input (cr + cr + keyword); // MacOS Classic line endings
        std::string const res = p3.eof ();
        EXPECT_FALSE (p3.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p3.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p4;
        p4.input (crlf + crlf + keyword); // Windows-style CRLF
        std::string const res = p4.eof ();
        EXPECT_FALSE (p4.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p4.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p5;
        // Nobody's line-endings. Each counts as a new line. Note that the middle cr+lf pair will
        // match a single Windows crlf.
        std::string const res = p5.input (lf + cr + lf + cr + keyword).eof ();
        EXPECT_FALSE (p5.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p5.coordinate (), (json::coord{xord, 4U}));
    }
    {
        json::parser<json_out_callbacks> p6;
        p6.input (lf + lf + crlf + cr + keyword); // A groovy mixture of line-ending characters.
        std::string const res = p6.eof ();
        EXPECT_FALSE (p6.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p6.coordinate (), (json::coord{xord, 5U}));
    }
}